

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O3

SRes LzmaEnc_AllocAndInit(CLzmaEnc *p,UInt32 keepWindowSize,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  CMatchFinder *p_00;
  UInt32 matchMaxLen;
  size_t sVar1;
  Byte *pBVar2;
  UInt16 *pUVar3;
  int iVar4;
  UInt32 keepAddBufferBefore;
  uint uVar5;
  
  iVar4 = 0;
  do {
    if (p->dictSize <= (uint)(1 << ((byte)iVar4 & 0x1f))) goto LAB_00110786;
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x1f);
  iVar4 = 0x1f;
LAB_00110786:
  p->distTableSize = iVar4 * 2;
  p->finished = 0;
  p->result = 0;
  if ((p->rc).bufBase == (Byte *)0x0) {
    pBVar2 = (Byte *)(*alloc->Alloc)(alloc,0x10000);
    (p->rc).bufBase = pBVar2;
    if (pBVar2 == (Byte *)0x0) {
      return 2;
    }
    (p->rc).bufLim = pBVar2 + 0x10000;
  }
  uVar5 = p->lp + p->lc;
  if (((p->litProbs == (UInt16 *)0x0) || ((p->saveState).litProbs == (UInt16 *)0x0)) ||
     (p->lclp != uVar5)) {
    (*alloc->Free)(alloc,p->litProbs);
    (*alloc->Free)(alloc,(p->saveState).litProbs);
    p->litProbs = (UInt16 *)0x0;
    (p->saveState).litProbs = (UInt16 *)0x0;
    sVar1 = (ulong)(uint)(0x300 << ((byte)uVar5 & 0x1f)) * 2;
    pUVar3 = (UInt16 *)(*alloc->Alloc)(alloc,sVar1);
    p->litProbs = pUVar3;
    pUVar3 = (UInt16 *)(*alloc->Alloc)(alloc,sVar1);
    (p->saveState).litProbs = pUVar3;
    if ((p->litProbs == (UInt16 *)0x0) || (pUVar3 == (UInt16 *)0x0)) {
      (*alloc->Free)(alloc,p->litProbs);
      (*alloc->Free)(alloc,(p->saveState).litProbs);
      p->litProbs = (UInt16 *)0x0;
      (p->saveState).litProbs = (UInt16 *)0x0;
      return 2;
    }
    p->lclp = uVar5;
  }
  matchMaxLen = p->numFastBytes;
  uVar5 = p->dictSize;
  (p->matchFinderBase).bigHash = 0x1000000 < uVar5;
  p_00 = &p->matchFinderBase;
  keepAddBufferBefore = keepWindowSize - uVar5;
  if (keepWindowSize <= uVar5 + 0x1000) {
    keepAddBufferBefore = 0x1000;
  }
  iVar4 = MatchFinder_Create(p_00,uVar5,keepAddBufferBefore,matchMaxLen,0x111,allocBig);
  if (iVar4 == 0) {
    return 2;
  }
  p->matchFinderObj = p_00;
  MatchFinder_CreateVTable(p_00,&p->matchFinder);
  LzmaEnc_Init(p);
  LzmaEnc_InitPrices(p);
  p->nowPos64 = 0;
  return 0;
}

Assistant:

static SRes LzmaEnc_AllocAndInit(CLzmaEnc *p, UInt32 keepWindowSize, ISzAlloc *alloc, ISzAlloc *allocBig)
{
  UInt32 i;
  for (i = 0; i < (UInt32)kDicLogSizeMaxCompress; i++)
    if (p->dictSize <= ((UInt32)1 << i))
      break;
  p->distTableSize = i * 2;

  p->finished = False;
  p->result = SZ_OK;
  RINOK(LzmaEnc_Alloc(p, keepWindowSize, alloc, allocBig));
  LzmaEnc_Init(p);
  LzmaEnc_InitPrices(p);
  p->nowPos64 = 0;
  return SZ_OK;
}